

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_35::InMemoryDirectory::stat(InMemoryDirectory *this,char *__file,stat *__buf)

{
  Impl *pIVar1;
  uint64_t hash;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  InMemoryDirectory *this_local;
  
  lock.ptr = (Impl *)__file;
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockShared
            ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&hash);
  pIVar1 = Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                     ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&hash);
  FsNode::Metadata::Metadata
            ((Metadata *)this,DIRECTORY,0,0,(Date)(pIVar1->lastModified).value.value,1,
             (uint64_t)__file);
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
            ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&hash);
  return (int)this;
}

Assistant:

Metadata stat() const override {
    auto lock = impl.lockShared();
    uint64_t hash = reinterpret_cast<uintptr_t>(this);
    return Metadata { Type::DIRECTORY, 0, 0, lock->lastModified, 1, hash };
  }